

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# appender.cpp
# Opt level: O1

void __thiscall
duckdb::BaseAppender::AppendValueInternal<double,signed_char>
          (BaseAppender *this,Vector *col,double input)

{
  bool bVar1;
  InvalidInputException *this_00;
  duckdb *this_01;
  char result;
  data_t local_41;
  double local_40;
  string local_38;
  
  this_01 = (duckdb *)0x0;
  local_40 = input;
  bVar1 = TryCast::Operation<double,signed_char>(input,(int8_t *)&local_41,false);
  if (bVar1) {
    col->data[(this->chunk).count] = local_41;
    return;
  }
  this_00 = (InvalidInputException *)__cxa_allocate_exception(0x10);
  CastExceptionText<double,signed_char>(&local_38,this_01,local_40);
  InvalidInputException::InvalidInputException(this_00,&local_38);
  __cxa_throw(this_00,&InvalidInputException::typeinfo,::std::runtime_error::~runtime_error);
}

Assistant:

void BaseAppender::AppendValueInternal(Vector &col, SRC input) {
	FlatVector::GetData<DST>(col)[chunk.size()] = Cast::Operation<SRC, DST>(input);
}